

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O1

unique_ptr<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>_>
 build_section<(pstore::repo::section_kind)0,pstore::repo::generic_section,pstore::repo::generic_section_creation_dispatcher>
           (not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer,
           section_content *content)

{
  section_content *in_RDX;
  generic_section_creation_dispatcher dispatcher;
  not_null<const_pstore::repo::section_content_*> local_38;
  section_creation_dispatcher local_30;
  section_content *local_20;
  
  local_38.ptr_ = in_RDX;
  pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant(&local_38);
  local_30.kind_ = text;
  local_30._vptr_section_creation_dispatcher =
       (_func_int **)&PTR__section_creation_dispatcher_00244e90;
  local_20 = local_38.ptr_;
  dispatch_new_section<(pstore::repo::section_kind)0,pstore::repo::generic_section_creation_dispatcher>
            ((generic_section_creation_dispatcher *)buffer.ptr_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  pstore::repo::section_creation_dispatcher::~section_creation_dispatcher(&local_30);
  return (__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
          )(__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
            )buffer.ptr_;
}

Assistant:

decltype (auto) build_section (pstore::gsl::not_null<std::vector<std::uint8_t> *> const buffer,
                               pstore::repo::section_content const & content) {
    CreationDispatcher dispatcher{Kind, &content};
    return dispatch_new_section<Kind> (dispatcher, buffer);
}